

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocs_test.cc
# Opt level: O0

int test_replace_authentic_ip(void)

{
  code *pcVar1;
  char *__s;
  OcsReplaceAuthenticIPRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1d1;
  int ret;
  HttpTestListener *local_1b0;
  HttpTestListener *listener;
  string local_1a0;
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [55];
  allocator<char> local_119;
  string local_118 [32];
  OcsReplaceAuthenticIPRequestType *local_f8;
  Ocs *ocs;
  undefined1 local_e8 [7];
  OcsReplaceAuthenticIPResponseType resp;
  OcsReplaceAuthenticIPRequestType req;
  
  aliyun::OcsReplaceAuthenticIPRequestType::OcsReplaceAuthenticIPRequestType
            ((OcsReplaceAuthenticIPRequestType *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"cn-hangzhou",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"my_appid",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"my_secret",&local_179);
  pOVar2 = (OcsReplaceAuthenticIPRequestType *)
           aliyun::Ocs::CreateOcsClient(local_118,local_150,local_178);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  local_f8 = pOVar2;
  if (pOVar2 == (OcsReplaceAuthenticIPRequestType *)0x0) {
    aliyun::OcsReplaceAuthenticIPRequestType::~OcsReplaceAuthenticIPRequestType
              ((OcsReplaceAuthenticIPRequestType *)local_e8);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetProxyHost((Ocs *)pOVar2,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetUseTls((Ocs *)local_f8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_replace_authentic_ip_response;
  local_1b0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1d1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1d1);
  HttpTestListener::Start(local_1b0);
  std::__cxx11::string::operator=((string *)local_e8,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.owner_account.field_2._M_local_buf + 8),"InstanceId");
  std::__cxx11::string::operator=
            ((string *)(req.instance_id.field_2._M_local_buf + 8),"OldAuthenticIP");
  std::__cxx11::string::operator=
            ((string *)(req.old_authentic_ip.field_2._M_local_buf + 8),"NewAuthenticIP");
  aliyun::Ocs::ReplaceAuthenticIP
            (local_f8,(OcsReplaceAuthenticIPResponseType *)local_e8,(OcsErrorInfo *)((long)&ocs + 7)
            );
  HttpTestListener::WaitComplete(local_1b0);
  pHVar3 = local_1b0;
  if (local_1b0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1b0);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_f8;
  if (local_f8 != (OcsReplaceAuthenticIPRequestType *)0x0) {
    aliyun::Ocs::~Ocs((Ocs *)local_f8);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_replace_authentic_ip() {
  OcsReplaceAuthenticIPRequestType req;
  OcsReplaceAuthenticIPResponseType resp;
  Ocs* ocs = Ocs::CreateOcsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ocs) return 0;
  ocs->SetProxyHost("127.0.0.1:12234");
  ocs->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_replace_authentic_ip_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.instance_id = "InstanceId";
  req.old_authentic_ip = "OldAuthenticIP";
  req.new_authentic_ip = "NewAuthenticIP";
  int ret = ocs->ReplaceAuthenticIP(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ocs;
}